

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

bool __thiscall pbrt::GeometricPrimitive::IntersectP(GeometricPrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  Shape *in_RDI;
  Float in_stack_0000021c;
  Ray *in_stack_00000220;
  GeometricPrimitive *in_stack_00000228;
  undefined8 in_stack_fffffffffffffeb0;
  Float tMax_00;
  optional<pbrt::ShapeIntersection> *this_00;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  optional<pbrt::ShapeIntersection> local_128;
  byte local_1;
  
  tMax_00 = (Float)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDI + 5));
  if (bVar1) {
    this_00 = &local_128;
    Intersect(in_stack_00000228,in_stack_00000220,in_stack_0000021c);
    local_1 = pstd::optional<pbrt::ShapeIntersection>::has_value(this_00);
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x86b488);
  }
  else {
    local_1 = Shape::IntersectP(in_RDI,(Ray *)CONCAT17(in_stack_fffffffffffffebf,
                                                       in_stack_fffffffffffffeb8),tMax_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool GeometricPrimitive::IntersectP(const Ray &r, Float tMax) const {
    if (alpha)
        return Intersect(r, tMax).has_value();
    else
        return shape.IntersectP(r, tMax);
}